

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O2

void __thiscall
randomx::VmBase<randomx::AlignedAllocator<64UL>,_true>::~VmBase
          (VmBase<randomx::AlignedAllocator<64UL>,_true> *this)

{
  (this->super_randomx_vm)._vptr_randomx_vm = (_func_int **)&PTR__VmBase_0012ec38;
  AlignedAllocator<64UL>::freeMemory((this->super_randomx_vm).scratchpad,0x200000);
  randomx_vm::~randomx_vm(&this->super_randomx_vm);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}